

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall liblogger::LogFile::Log(LogFile *this,LogType Type,string *str)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  LogException *this_00;
  string *message;
  LogType in_ESI;
  long in_RDI;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  string *in_stack_fffffffffffff9a8;
  LogException *in_stack_fffffffffffff9b0;
  stringstream local_5d0 [16];
  ostream local_5c0 [383];
  undefined1 local_441;
  stringstream local_420 [16];
  ostream local_410 [383];
  undefined1 local_291;
  stringstream local_260 [16];
  ostream local_250 [376];
  char local_d8 [128];
  tm local_58;
  time_t local_20 [2];
  LogType local_c;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_c = in_ESI;
    local_20[0] = time((time_t *)0x0);
    localtime_r(local_20,&local_58);
    sVar3 = strftime(local_d8,0x80,"%F %T",&local_58);
    if (sVar3 == 0) {
      std::__cxx11::stringstream::stringstream(local_260);
      poVar4 = std::operator<<(local_250,"strftime failed: \'");
      poVar4 = std::operator<<(poVar4,"\' error: ");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator<<(poVar4,pcVar6);
      local_291 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      local_291 = 0;
      __cxa_throw(uVar7,&LogException::typeinfo,LogException::~LogException);
    }
    __stream = *(FILE **)(in_RDI + 0x28);
    LogTypeToStr_abi_cxx11_(local_c);
    uVar7 = std::__cxx11::string::c_str();
    uVar1 = getpid();
    uVar8 = std::__cxx11::string::c_str();
    iVar2 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",local_d8,uVar7,(ulong)uVar1,uVar8);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_420);
      poVar4 = std::operator<<(local_410,"failed to write to file \'");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar6);
      this_00 = (LogException *)std::operator<<(poVar4,"\' error:");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator<<((ostream *)this_00,pcVar6);
      local_441 = 1;
      message = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(this_00,message);
      local_441 = 0;
      __cxa_throw(message,&LogException::typeinfo,LogException::~LogException);
    }
    iVar2 = fflush(*(FILE **)(in_RDI + 0x28));
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_5d0);
      poVar4 = std::operator<<(local_5c0,"failed to fflush to file \'");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar6);
      poVar4 = std::operator<<(poVar4,"\' error:");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator<<(poVar4,pcVar6);
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      __cxa_throw(uVar7,&LogException::typeinfo,LogException::~LogException);
    }
  }
  return;
}

Assistant:

void LogFile::Log(const LogType Type, const std::string &str)
{
	if (m_fp == NULL)
		return;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to file '" << m_fname.c_str() << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to fflush to file '" << m_fname.c_str() << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}